

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int *piVar2;
  int a;
  uint uVar3;
  parasail_result_t *ppVar4;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  long lVar5;
  int64_t *ptr_02;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  undefined8 extraout_RDX;
  int64_t *piVar12;
  int iVar13;
  int64_t *piVar14;
  ulong uVar15;
  bool bVar16;
  undefined4 in_register_00000034;
  char *__format;
  int iVar18;
  int64_t *piVar19;
  int64_t iVar20;
  ulong uVar21;
  ulong extraout_XMM0_Qa;
  undefined1 auVar22 [16];
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  int64_t iVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined1 extraout_XMM0 [16];
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar26 [16];
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar31;
  __m128i_64_t A_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  ulong uVar34;
  __m128i_64_t A;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  int iVar44;
  __m128i_64_t B_2;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i_64_t B_1;
  undefined1 auVar49 [16];
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i alVar50;
  __m128i alVar51;
  ulong local_2f8;
  ulong uStack_2c0;
  ulong uStack_2a0;
  long local_290;
  int64_t *local_288;
  ulong uStack_280;
  ulong uStack_270;
  undefined1 local_268 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  int64_t *local_208;
  ulong uStack_200;
  int64_t *local_1d8;
  ulong uStack_1d0;
  int64_t *local_1c8;
  ulong uStack_1c0;
  int64_t *local_1b8;
  ulong uStack_1b0;
  int64_t *local_1a8;
  ulong uStack_1a0;
  long local_198;
  long local_190;
  ulong local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  int64_t *local_158;
  ulong uStack_150;
  int64_t *local_148;
  ulong uStack_140;
  int64_t *local_138;
  ulong uStack_130;
  int64_t *local_128;
  ulong uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  long local_108;
  long lStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  long lStack_40;
  parasail_matrix_t *ppVar17;
  
  piVar12 = (int64_t *)CONCAT44(in_register_00000034,_s1Len);
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar11 = "_s2";
LAB_00556bd1:
    fprintf(_stderr,__format,"parasail_sg_flags_table_diag_sse2_128_64",pcVar11);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar11 = "s2Len";
    goto LAB_00556bd1;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar11 = "open";
    goto LAB_00556bd1;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar11 = "gap";
    goto LAB_00556bd1;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar11 = "matrix";
    goto LAB_00556bd1;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar11 = "_s1";
      goto LAB_00556bd1;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar11 = "_s1Len";
      goto LAB_00556bd1;
    }
  }
  else {
    piVar12 = (int64_t *)(ulong)(uint)matrix->length;
  }
  a = (int)piVar12;
  iVar13 = matrix->min;
  iVar18 = -open;
  uVar9 = 0x8000000000000000 - (long)iVar13;
  if (iVar13 != iVar18 && SBORROW4(iVar13,iVar18) == iVar13 + open < 0) {
    uVar9 = (ulong)(uint)open | 0x8000000000000000;
  }
  piVar19 = (int64_t *)(uVar9 + 1);
  alVar50[1] = 0x7ffffffffffffffe - (long)matrix->max;
  auVar22._8_4_ = (int)piVar19;
  auVar22._0_8_ = piVar19;
  auVar22._12_4_ = (int)((ulong)piVar19 >> 0x20);
  local_168 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_168._4_4_ = 0;
    local_168._0_4_ = gap * 2;
    local_168._8_4_ = gap * 2;
    local_168._12_4_ = 0;
  }
  uStack_270 = auVar22._8_8_;
  uStack_120 = uStack_270;
  uStack_130 = uStack_270;
  uStack_140 = uStack_270;
  uStack_1a0 = uStack_270;
  uStack_150 = uStack_270;
  if (s1_beg == 0) {
    local_238._8_8_ = (long)iVar18;
    local_238._0_8_ = (long)(iVar18 - gap);
  }
  local_1a8 = piVar19;
  local_158 = piVar19;
  local_148 = piVar19;
  local_138 = piVar19;
  local_128 = piVar19;
  ppVar4 = parasail_result_new_table1(a,s2Len);
  if (ppVar4 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar4->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar4->flag | 0x2821002;
  uVar9 = (ulong)(s2Len + 2);
  ptr = parasail_memalign_int64_t(0x10,uVar9);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar9);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar9);
  if (ptr_01 == (int64_t *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar5 = (long)a;
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int64_t(0x10,(long)(a + 1));
    uVar9 = 0;
    if (ptr_02 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    uVar10 = 0;
    if (0 < a) {
      uVar10 = (ulong)piVar12 & 0xffffffff;
    }
    for (; lVar6 = lVar5, uVar10 != uVar9; uVar9 = uVar9 + 1) {
      piVar12 = (int64_t *)(long)matrix->mapper[(byte)_s1[uVar9]];
      ptr_02[uVar9] = (int64_t)piVar12;
    }
    for (; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
      ptr_02[lVar6] = 0;
    }
  }
  else {
    ptr_02 = (int64_t *)0x0;
    piVar12 = (int64_t *)CONCAT71((int7)((ulong)extraout_RDX >> 8),ptr == (int64_t *)0x0);
  }
  uVar10 = (ulong)(uint)s2Len;
  local_f8._8_4_ = a;
  local_f8._0_8_ = lVar5;
  local_f8._12_4_ = a >> 0x1f;
  auVar23._8_4_ = 0xffffffff;
  auVar23._0_8_ = 0xffffffffffffffff;
  auVar23._12_4_ = 0xffffffff;
  local_c8._0_8_ = CONCAT44(0,s2Len);
  local_c8._8_4_ = s2Len;
  local_c8._12_4_ = 0;
  local_178._8_4_ = (int)alVar50[1];
  local_178._0_8_ = alVar50[1];
  local_178._12_4_ = (int)((ulong)alVar50[1] >> 0x20);
  local_d8._4_4_ = 0;
  local_d8._0_4_ = open;
  local_d8._8_4_ = open;
  local_d8._12_4_ = 0;
  local_e8._4_4_ = 0;
  local_e8._0_4_ = gap;
  local_e8._8_4_ = gap;
  local_e8._12_4_ = 0;
  local_108 = lVar5 + -1;
  lStack_100 = local_f8._8_8_ + auVar23._8_8_;
  local_b8._0_8_ = local_c8._0_8_ - 1;
  local_b8._8_8_ = auVar23._8_8_ + (ulong)(uint)s2Len;
  piVar1 = matrix->mapper;
  for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    piVar12 = (int64_t *)(long)piVar1[(byte)_s2[uVar9]];
    ptr[uVar9 + 1] = (int64_t)piVar12;
  }
  *ptr = 0;
  for (uVar9 = uVar10; (int)uVar9 <= s2Len; uVar9 = uVar9 + 1) {
    ptr[uVar9 + 1] = 0;
  }
  uVar9 = 0;
  alVar50[1] = (long)iVar18;
  if (s2_beg == 0) {
    for (; piVar12 = ptr_01, uVar10 != uVar9; uVar9 = uVar9 + 1) {
      ptr_00[uVar9 + 1] = alVar50[1];
      ptr_01[uVar9 + 1] = (int64_t)piVar19;
      alVar50[1] = alVar50[1] - (ulong)(uint)gap;
    }
  }
  else {
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      ptr_00[uVar9 + 1] = 0;
      ptr_01[uVar9 + 1] = (int64_t)piVar19;
    }
  }
  *ptr_01 = (int64_t)piVar19;
  for (uVar9 = uVar10; (int)uVar9 <= s2Len; uVar9 = uVar9 + 1) {
    ptr_00[uVar9 + 1] = (int64_t)piVar19;
    ptr_01[uVar9 + 1] = (int64_t)piVar19;
  }
  *ptr_00 = 0;
  local_118 = uStack_270;
  uStack_110 = 0;
  local_190 = uVar10 * 8;
  local_198 = uVar10 * 4;
  local_268 = ZEXT416(1);
  local_290 = 0;
  uStack_1b0 = uStack_270;
  uStack_1c0 = uStack_270;
  uStack_1d0 = uStack_270;
  uStack_280 = uStack_270;
  uStack_200 = uStack_270;
  b_01[1] = ptr_01;
  uVar9 = 0;
  piVar14 = ptr;
  local_288 = piVar19;
  local_208 = piVar19;
  local_1d8 = piVar19;
  local_1c8 = piVar19;
  local_1b8 = piVar19;
  while ((long)uVar9 < lVar5) {
    if (matrix->type == 0) {
      uVar21 = ptr_02[uVar9];
      iVar20 = ptr_02[uVar9 + 1];
    }
    else {
      uVar3 = a - 1U;
      if ((long)(uVar9 | 1) < lVar5) {
        uVar3 = (uint)uVar9 | 1;
      }
      iVar20 = (int64_t)(int)uVar3;
      uVar21 = uVar9;
    }
    piVar1 = matrix->matrix;
    iVar13 = matrix->size;
    alVar51[1] = (longlong)piVar14;
    alVar51[0] = (longlong)matrix;
    b[1] = (longlong)b_01[1];
    b[0] = (longlong)piVar12;
    ppVar17 = matrix;
    alVar50 = _mm_cmplt_epi64_rpl(alVar51,b);
    b_00[0] = alVar50[1];
    a_00[1] = (longlong)piVar14;
    a_00[0] = (longlong)ppVar17;
    b_00[1] = (longlong)b_01[1];
    local_98 = extraout_XMM0_Qa;
    uStack_90 = extraout_XMM0_Qb;
    alVar50 = _mm_cmpeq_epi64_rpl(a_00,b_00);
    piVar12 = alVar50[1];
    local_a8 = extraout_XMM0_Qa_00;
    uStack_a0 = extraout_XMM0_Qb_00;
    iVar7 = iVar18 - (uint)uVar9 * gap;
    iVar27 = *ptr_00;
    if (s1_beg != 0) {
      iVar7 = 0;
    }
    uStack_2a0 = (ulong)iVar7;
    local_188 = uVar9 + 2;
    b_01[1] = (int64_t *)((long)iVar18 - (uVar9 + 2) * (ulong)(uint)gap);
    *ptr_00 = (int64_t)b_01[1];
    local_180 = local_198 * (uVar9 | 1);
    uVar15 = 0;
    uVar34 = 0xffffffffffffffff;
    uStack_2c0 = 0;
    uVar41 = local_118;
    uVar28 = local_118;
    local_228 = auVar22;
    local_218 = auVar22;
    while( true ) {
      if (uVar10 < uVar15) break;
      lStack_40 = ptr_00[uVar15 + 1];
      auVar47._0_8_ = uStack_2a0 - local_d8._0_8_;
      auVar47._8_8_ = lStack_40 - local_d8._8_8_;
      auVar43._0_8_ = CONCAT44(local_228._4_4_,local_228._8_4_) - local_e8._0_8_;
      auVar43._8_8_ = ptr_01[uVar15 + 1] - local_e8._8_8_;
      auVar48._0_8_ = uVar41 - local_d8._0_8_;
      auVar48._8_8_ = uStack_2a0 - local_d8._8_8_;
      auVar49._0_8_ = local_218._0_8_ - local_e8._0_8_;
      auVar49._8_8_ = local_218._8_8_ - local_e8._8_8_;
      alVar50[1] = (long)piVar1[uVar21 * (long)iVar13 + ptr[uVar15 + 1]];
      auVar29._0_8_ = (long)piVar1[iVar20 * iVar13 + ptr[uVar15]] + uVar28;
      auVar29._8_8_ = alVar50[1] + iVar27;
      auVar23 = auVar43 ^ _DAT_008a1890;
      auVar37 = auVar47 ^ _DAT_008a1890;
      iVar7 = -(uint)(auVar23._0_4_ < auVar37._0_4_);
      auVar42._4_4_ = -(uint)(auVar23._4_4_ < auVar37._4_4_);
      iVar44 = -(uint)(auVar23._8_4_ < auVar37._8_4_);
      auVar42._12_4_ = -(uint)(auVar23._12_4_ < auVar37._12_4_);
      auVar45._4_4_ = iVar7;
      auVar45._0_4_ = iVar7;
      auVar45._8_4_ = iVar44;
      auVar45._12_4_ = iVar44;
      iVar7 = -(uint)(auVar37._4_4_ == auVar23._4_4_);
      iVar44 = -(uint)(auVar37._12_4_ == auVar23._12_4_);
      auVar37._4_4_ = iVar7;
      auVar37._0_4_ = iVar7;
      auVar37._8_4_ = iVar44;
      auVar37._12_4_ = iVar44;
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar42 = auVar42 | auVar37 & auVar45;
      auVar43 = ~auVar42 & auVar43 | auVar47 & auVar42;
      auVar23 = auVar49 ^ _DAT_008a1890;
      auVar37 = auVar48 ^ _DAT_008a1890;
      iVar7 = -(uint)(auVar23._0_4_ < auVar37._0_4_);
      iVar35 = -(uint)(auVar23._4_4_ < auVar37._4_4_);
      iVar44 = -(uint)(auVar23._8_4_ < auVar37._8_4_);
      iVar36 = -(uint)(auVar23._12_4_ < auVar37._12_4_);
      auVar38._4_4_ = iVar7;
      auVar38._0_4_ = iVar7;
      auVar38._8_4_ = iVar44;
      auVar38._12_4_ = iVar44;
      iVar7 = -(uint)(auVar37._4_4_ == auVar23._4_4_);
      iVar44 = -(uint)(auVar37._12_4_ == auVar23._12_4_);
      auVar33._4_4_ = iVar7;
      auVar33._0_4_ = iVar7;
      auVar33._8_4_ = iVar44;
      auVar33._12_4_ = iVar44;
      auVar46._4_4_ = iVar35;
      auVar46._0_4_ = iVar35;
      auVar46._8_4_ = iVar36;
      auVar46._12_4_ = iVar36;
      auVar46 = auVar46 | auVar33 & auVar38;
      auVar47 = ~auVar46 & auVar49 | auVar48 & auVar46;
      auVar23 = auVar47 ^ _DAT_008a1890;
      auVar37 = auVar29 ^ _DAT_008a1890;
      iVar7 = -(uint)(auVar23._0_4_ < auVar37._0_4_);
      iVar35 = -(uint)(auVar23._4_4_ < auVar37._4_4_);
      iVar44 = -(uint)(auVar23._8_4_ < auVar37._8_4_);
      iVar36 = -(uint)(auVar23._12_4_ < auVar37._12_4_);
      auVar39._4_4_ = iVar7;
      auVar39._0_4_ = iVar7;
      auVar39._8_4_ = iVar44;
      auVar39._12_4_ = iVar44;
      iVar7 = -(uint)(auVar37._4_4_ == auVar23._4_4_);
      iVar44 = -(uint)(auVar37._12_4_ == auVar23._12_4_);
      auVar24._4_4_ = iVar7;
      auVar24._0_4_ = iVar7;
      auVar24._8_4_ = iVar44;
      auVar24._12_4_ = iVar44;
      auVar32._4_4_ = iVar35;
      auVar32._0_4_ = iVar35;
      auVar32._8_4_ = iVar36;
      auVar32._12_4_ = iVar36;
      auVar32 = auVar32 | auVar24 & auVar39;
      auVar33 = ~auVar32 & auVar47 | auVar29 & auVar32;
      auVar23 = auVar33 ^ _DAT_008a1890;
      auVar37 = auVar43 ^ _DAT_008a1890;
      iVar7 = -(uint)(auVar37._0_4_ < auVar23._0_4_);
      iVar35 = -(uint)(auVar37._4_4_ < auVar23._4_4_);
      iVar44 = -(uint)(auVar37._8_4_ < auVar23._8_4_);
      iVar36 = -(uint)(auVar37._12_4_ < auVar23._12_4_);
      auVar40._4_4_ = iVar7;
      auVar40._0_4_ = iVar7;
      auVar40._8_4_ = iVar44;
      auVar40._12_4_ = iVar44;
      iVar7 = -(uint)(auVar37._4_4_ == auVar23._4_4_);
      iVar44 = -(uint)(auVar37._12_4_ == auVar23._12_4_);
      auVar25._4_4_ = iVar7;
      auVar25._0_4_ = iVar7;
      auVar25._8_4_ = iVar44;
      auVar25._12_4_ = iVar44;
      auVar30._4_4_ = iVar35;
      auVar30._0_4_ = iVar35;
      auVar30._8_4_ = iVar36;
      auVar30._12_4_ = iVar36;
      auVar30 = auVar30 | auVar25 & auVar40;
      a_01[1] = (longlong)piVar14;
      a_01[0] = (longlong)ppVar17;
      alVar50[0] = (longlong)piVar12;
      local_48 = uStack_2a0;
      alVar51 = _mm_cmpeq_epi64_rpl(a_01,alVar50);
      auVar23 = extraout_XMM0 & local_238 |
                ~extraout_XMM0 & (~auVar30 & auVar43 | auVar33 & auVar30);
      piVar2 = ((ppVar4->field_4).rowcols)->score_row;
      if (uVar15 < uVar10) {
        alVar50[1] = local_290 + (long)piVar2;
        *(int *)(alVar50[1] + uVar15 * 4) = auVar23._8_4_;
      }
      local_228 = ~extraout_XMM0 & auVar43 | extraout_XMM0 & auVar22;
      bVar16 = lVar5 <= (long)(uVar9 | 1);
      b_01[1] = (int64_t *)CONCAT71((int7)((ulong)alVar50[1] >> 8),bVar16);
      b_01[0]._1_7_ = alVar51[1]._1_7_;
      b_01[0]._0_1_ = uVar15 == 0 || bVar16;
      if (uVar15 != 0 && !bVar16) {
        *(int *)((long)piVar2 + uVar15 * 4 + local_180 + -4) = auVar23._0_4_;
      }
      local_218 = ~extraout_XMM0 & auVar47 | extraout_XMM0 & auVar22;
      uVar41 = auVar23._0_8_;
      ptr_00[uVar15] = uVar41;
      ptr_01[uVar15] = local_228._0_8_;
      a_02[1] = (longlong)piVar14;
      a_02[0] = (longlong)ppVar17;
      alVar50 = _mm_cmpeq_epi64_rpl(a_02,b_01);
      b_02[0] = alVar50[1];
      a_03[1] = (longlong)piVar14;
      a_03[0] = (longlong)ppVar17;
      b_02[1] = (longlong)b_01[1];
      local_58 = extraout_XMM0_Qa_01;
      uStack_50 = extraout_XMM0_Qb_01;
      alVar50 = _mm_cmpgt_epi64_rpl(a_03,b_02);
      b_03[0] = alVar50[1];
      a_04[1] = (longlong)piVar14;
      a_04[0] = (longlong)ppVar17;
      b_03[1] = (longlong)b_01[1];
      local_68 = extraout_XMM0_Qa_02;
      uStack_60 = extraout_XMM0_Qb_02;
      alVar50 = _mm_cmplt_epi64_rpl(a_04,b_03);
      b_04[0] = alVar50[1];
      a_05[1] = (longlong)piVar14;
      a_05[0] = (longlong)ppVar17;
      b_04[1] = (longlong)b_01[1];
      local_78 = extraout_XMM0_Qa_03;
      uStack_70 = extraout_XMM0_Qb_03;
      alVar50 = _mm_cmpgt_epi64_rpl(a_05,b_04);
      b_05[0] = alVar50[1];
      a_06[1] = (longlong)piVar14;
      a_06[0] = (longlong)ppVar17;
      b_05[1] = (longlong)b_01[1];
      local_88 = extraout_XMM0_Qa_04;
      uStack_80 = extraout_XMM0_Qb_04;
      alVar50 = _mm_cmpgt_epi64_rpl(a_06,b_05);
      piVar12 = alVar50[1];
      uStack_2a0 = auVar23._8_8_;
      local_88 = local_78 & local_68 & local_a8 & local_88;
      uStack_80 = uStack_70 & uStack_60 & uStack_a0 & uStack_80;
      uVar28 = local_98 & local_58 & extraout_XMM0_Qa_05;
      uVar31 = uStack_90 & uStack_50 & extraout_XMM0_Qb_05;
      local_208 = (int64_t *)(local_88 & uVar41 | ~local_88 & (ulong)local_208);
      uStack_200 = uStack_80 & uStack_2a0 | ~uStack_80 & uStack_200;
      local_288 = (int64_t *)(uVar28 & uVar41 | ~uVar28 & (ulong)local_288);
      uStack_280 = uVar31 & uStack_2a0 | ~uVar31 & uStack_280;
      local_1d8 = (int64_t *)
                  (local_58 & local_a8 & uVar41 | ~(local_58 & local_a8) & (ulong)local_1d8);
      uStack_1d0 = uStack_50 & uStack_a0 & uStack_2a0 | ~(uStack_50 & uStack_a0) & uStack_1d0;
      local_1c8 = (int64_t *)(uVar28 & local_268._0_8_ | ~uVar28 & (ulong)local_1c8);
      uStack_1c0 = uVar31 & local_268._8_8_ | ~uVar31 & uStack_1c0;
      local_1b8 = (int64_t *)(local_88 & uVar34 | ~local_88 & (ulong)local_1b8);
      uStack_1b0 = uStack_80 & uStack_2c0 | ~uStack_80 & uStack_1b0;
      uVar34 = uVar34 + 1;
      uStack_2c0 = uStack_2c0 + 1;
      uVar15 = uVar15 + 1;
      uVar28 = local_48;
      iVar27 = lStack_40;
    }
    local_268._8_8_ = local_268._8_8_ + 2;
    local_268._0_8_ = local_268._0_8_ + 2;
    local_238._8_8_ = local_238._8_8_ - local_168._8_8_;
    local_238._0_8_ = local_238._0_8_ - local_168._0_8_;
    local_290 = local_290 + local_190;
    uVar9 = local_188;
  }
  local_128 = local_208;
  uStack_120 = uStack_200;
  local_138 = local_288;
  uStack_130 = uStack_280;
  local_148 = local_1d8;
  uStack_140 = uStack_1d0;
  local_1a8 = local_1c8;
  uStack_1a0 = uStack_1c0;
  local_158 = local_1b8;
  uStack_150 = uStack_1b0;
  uVar9 = 0;
  uVar10 = 0;
  piVar12 = piVar19;
  ppVar17 = matrix;
  b_01[1] = piVar19;
  for (alVar50[1] = 0; uVar3 = (uint)uVar10, (int)alVar50[1] != 2; alVar50[1] = alVar50[1] + 1) {
    piVar14 = (&local_138)[alVar50[1]];
    if ((long)piVar12 < (long)piVar14) {
      ppVar17 = (parasail_matrix_t *)(&local_1a8)[alVar50[1]];
LAB_0055696e:
      uVar10 = (ulong)ppVar17 & 0xffffffff;
      piVar12 = piVar14;
    }
    else if ((piVar14 == piVar12) &&
            (ppVar17 = (parasail_matrix_t *)(&local_1a8)[alVar50[1]],
            (long)ppVar17 < (long)(int)uVar3)) goto LAB_0055696e;
    if ((long)b_01[1] < (long)(&local_128)[alVar50[1]]) {
      uVar9 = (ulong)*(uint *)(&local_158 + alVar50[1]);
      b_01[1] = (&local_128)[alVar50[1]];
    }
    piVar14 = (&local_148)[alVar50[1]];
    if ((long)piVar19 < (long)piVar14) {
      piVar19 = piVar14;
    }
  }
  uVar10 = CONCAT71((int7)((ulong)alVar50[1] >> 8),s2_end == 0);
  bVar16 = s1_end == 0 || s2_end == 0;
  a_07[1] = CONCAT71((int7)((ulong)piVar14 >> 8),bVar16);
  piVar14 = b_01[1];
  local_2f8 = uVar9;
  if (bVar16) {
    uVar10 = (ulong)(s2Len - 1U);
    uVar8 = s2Len - 1U;
    if (s1_end != 0) goto LAB_00556aef;
    piVar14 = piVar19;
    local_2f8 = uVar10;
    if (s2_end != 0) {
      piVar19 = b_01[1];
      uVar10 = uVar9;
      piVar14 = b_01[1];
      local_2f8 = uVar9;
    }
  }
  else {
    if ((long)b_01[1] < (long)piVar12) {
      uVar8 = s2Len - 1;
      goto LAB_00556aef;
    }
    if (piVar12 == b_01[1]) {
      uVar8 = s2Len - 1;
      piVar19 = (int64_t *)(ulong)uVar8;
      if ((uint)uVar9 == uVar8) goto LAB_00556aef;
    }
  }
  piVar12 = piVar14;
  uVar3 = a - 1U;
  uVar8 = (uint)local_2f8;
LAB_00556aef:
  local_2f8._0_4_ = uVar8;
  iVar13 = (int)piVar12;
  a_07[0] = (longlong)ppVar17;
  b_06[1] = (longlong)piVar19;
  b_06[0] = uVar10;
  alVar50 = _mm_cmplt_epi64_rpl(a_07,b_06);
  b_07[0] = alVar50[1];
  a_08[1] = a_07[1];
  a_08[0] = (longlong)ppVar17;
  b_07[1] = (longlong)piVar19;
  _mm_cmpgt_epi64_rpl(a_08,b_07);
  auVar26._8_8_ = extraout_XMM0_Qb_06;
  auVar26._0_8_ = extraout_XMM0_Qa_06;
  auVar26 = extraout_XMM0_00 | auVar26;
  if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar26 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar26 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar26 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar26 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar26 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0') {
    *(byte *)&ppVar4->flag = (byte)ppVar4->flag | 0x40;
    iVar13 = 0;
    local_2f8._0_4_ = 0;
    uVar3 = 0;
  }
  ppVar4->score = iVar13;
  ppVar4->end_query = uVar3;
  ppVar4->end_ref = (uint)local_2f8;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar4;
  }
  return ppVar4;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}